

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgroup_controller.cpp
# Opt level: O0

void __thiscall CgroupController::~CgroupController(CgroupController *this)

{
  bool bVar1;
  ContextManager *pCVar2;
  value_type *pvVar3;
  undefined8 uVar4;
  string local_60;
  string local_40;
  undefined1 local_20 [8];
  error_code error;
  CgroupController *this_local;
  
  error._M_cat = (error_category *)this;
  if (this->enter_fd_ != -1) {
    close_enter_fd(this);
  }
  std::error_code::error_code((error_code *)local_20);
  std::filesystem::remove(&this->path_,(error_code *)local_20);
  bVar1 = std::error_code::operator_cast_to_bool((error_code *)local_20);
  if (bVar1) {
    pCVar2 = ContextManager::get();
    pvVar3 = std::filesystem::__cxx11::path::c_str(&this->path_);
    std::error_code::message_abi_cxx11_(&local_60,(error_code *)local_20);
    uVar4 = std::__cxx11::string::c_str();
    format_abi_cxx11_(&local_40,"Cannot remove dir \'%s\': %s",pvVar3,uVar4);
    (**pCVar2->_vptr_ContextManager)(pCVar2,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_60);
  }
  std::filesystem::__cxx11::path::~path(&this->path_);
  return;
}

Assistant:

CgroupController::~CgroupController() {
    if (enter_fd_ != -1) close_enter_fd();
    std::error_code error;
    fs::remove(path_, error);
    if (error) {
        die(format("Cannot remove dir '%s': %s", path_.c_str(), error.message().c_str()));
    }
}